

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void free_esni_secret(st_ptls_esni_secret_t **esni,int is_server)

{
  int is_server_local;
  st_ptls_esni_secret_t **esni_local;
  
  if (*esni != (st_ptls_esni_secret_t *)0x0) {
    if (((*esni)->secret).base != (uint8_t *)0x0) {
      (*ptls_clear_memory)(((*esni)->secret).base,((*esni)->secret).len);
      free(((*esni)->secret).base);
    }
    if (is_server == 0) {
      free(((*esni)->field_3).client.pubkey.base);
    }
    (*ptls_clear_memory)(*esni,200);
    free(*esni);
    *esni = (st_ptls_esni_secret_t *)0x0;
    return;
  }
  __assert_fail("*esni != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                ,0x6b4,"void free_esni_secret(struct st_ptls_esni_secret_t **, int)");
}

Assistant:

static void free_esni_secret(struct st_ptls_esni_secret_t **esni, int is_server)
{
    assert(*esni != NULL);
    if ((*esni)->secret.base != NULL) {
        ptls_clear_memory((*esni)->secret.base, (*esni)->secret.len);
        free((*esni)->secret.base);
    }
    if (!is_server)
        free((*esni)->client.pubkey.base);
    ptls_clear_memory((*esni), sizeof(**esni));
    free(*esni);
    *esni = NULL;
}